

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O0

void __thiscall
Statsd::UDPSender::UDPSender
          (UDPSender *this,string *host,uint16_t port,uint64_t batchsize,uint64_t sendInterval)

{
  bool bVar1;
  ulong uVar2;
  type local_40;
  thread local_38;
  uint64_t local_30;
  uint64_t sendInterval_local;
  uint64_t batchsize_local;
  string *psStack_18;
  uint16_t port_local;
  string *host_local;
  UDPSender *this_local;
  
  local_30 = sendInterval;
  sendInterval_local = batchsize;
  batchsize_local._6_2_ = port;
  psStack_18 = host;
  host_local = (string *)this;
  std::atomic<bool>::atomic(&this->m_mustExit,false);
  std::__cxx11::string::string((string *)&this->m_host,(string *)psStack_18);
  this->m_port = batchsize_local._6_2_;
  this->m_socket = -1;
  this->m_batchsize = sendInterval_local;
  this->m_sendInterval = local_30;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&this->m_batchingMessageQueue);
  std::mutex::mutex(&this->m_batchingMutex);
  std::thread::thread(&this->m_batchingThread);
  std::__cxx11::string::string((string *)&this->m_errorMessage);
  uVar2 = std::__cxx11::string::empty();
  if (((((uVar2 & 1) == 0) && (bVar1 = initialize(this), bVar1)) && (this->m_batchsize != 0)) &&
     (this->m_sendInterval != 0)) {
    local_40.this = this;
    std::thread::
    thread<Statsd::UDPSender::UDPSender(std::__cxx11::string_const&,unsigned_short,unsigned_long,unsigned_long)::_lambda()_1_,,void>
              (&local_38,&local_40);
    std::thread::operator=(&this->m_batchingThread,&local_38);
    std::thread::~thread(&local_38);
  }
  return;
}

Assistant:

inline UDPSender::UDPSender(const std::string& host,
                            const uint16_t port,
                            const uint64_t batchsize,
                            const uint64_t sendInterval) noexcept
    : m_host(host), m_port(port), m_batchsize(batchsize), m_sendInterval(sendInterval) {
    // Initialize the socket
    if (m_host.empty() || !initialize()) {
        return;
    }

    // If batching is on, use a dedicated thread to send after the wait time is reached
    if (m_batchsize != 0 && m_sendInterval > 0) {
        // Define the batching thread
        m_batchingThread = std::thread([this] {
            // TODO: this will drop unsent stats, should we send all the unsent stats before we exit?
            while (!m_mustExit.load(std::memory_order_acquire)) {
                std::deque<std::string> stagedMessageQueue;

                std::unique_lock<std::mutex> batchingLock(m_batchingMutex);
                m_batchingMessageQueue.swap(stagedMessageQueue);
                batchingLock.unlock();

                // Flush the queue
                while (!stagedMessageQueue.empty()) {
                    sendToDaemon(stagedMessageQueue.front());
                    stagedMessageQueue.pop_front();
                }

                // Wait before sending the next batch
                std::this_thread::sleep_for(std::chrono::milliseconds(m_sendInterval));
            }
        });
    }
}